

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O3

void __thiscall
QPlainTestLogger::printBenchmarkResultsHeader(QPlainTestLogger *this,QBenchmarkResult *result)

{
  int iVar1;
  char *pcVar2;
  undefined8 extraout_RAX;
  char16_t *pcVar3;
  char16_t *pcVar4;
  size_t __n;
  long in_FS_OFFSET;
  QByteArray local_478;
  QString local_458;
  ulong local_438;
  char local_430 [1024];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_430,0xaa,0x400);
  local_438 = 0;
  local_430[0] = '\0';
  pcVar2 = QTestResult::currentTestObjectName();
  QString::toLatin1_helper(&local_458);
  if ((&(local_458.d.d)->super_QArrayData == (QArrayData *)0x0) ||
     (1 < ((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&local_458,(AllocationOption)local_458.d.size);
  }
  iVar1 = snprintf(local_430,0x3ff,"%s: %s::%s","RESULT ",pcVar2,local_458.d.ptr);
  local_438 = local_438 + (long)iVar1;
  if (&(local_458.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_458.d.d)->super_QArrayData,1,0x10);
    }
  }
  local_458.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_458.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_458.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = QTestResult::currentDataTag();
  QByteArray::QByteArray((QByteArray *)&local_458,pcVar2,-1);
  local_478.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_478.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_478.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = QTestResult::currentGlobalDataTag();
  QByteArray::QByteArray(&local_478,pcVar2,-1);
  if ((undefined1 *)local_478.d.size == (undefined1 *)0x0) {
    if ((undefined1 *)local_458.d.size != (undefined1 *)0x0) {
      pcVar3 = local_458.d.ptr;
      if (local_458.d.ptr == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QByteArray::_empty;
      }
      goto LAB_0012097f;
    }
    __n = 2;
    if (0x3fe - local_438 < 2) {
      __n = 0x3fe - local_438;
    }
    memcpy(local_430 + local_438,":\n",__n);
    local_438 = __n + local_438;
    if (0x3ff < local_438) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        printBenchmarkResultsHeader();
        if (&(local_458.d.d)->super_QArrayData != (QArrayData *)0x0) {
          printBenchmarkResultsHeader();
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          _Unwind_Resume(extraout_RAX);
        }
      }
      goto LAB_00120b0f;
    }
    local_430[local_438] = '\0';
  }
  else {
    pcVar3 = (char16_t *)local_478.d.ptr;
    if ((char16_t *)local_478.d.ptr == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QByteArray::_empty;
    }
    if ((undefined1 *)local_458.d.size == (undefined1 *)0x0) {
LAB_0012097f:
      iVar1 = snprintf(local_430 + local_438,0x3ff - local_438,":\"%s\":\n",pcVar3);
    }
    else {
      pcVar4 = local_458.d.ptr;
      if (local_458.d.ptr == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QByteArray::_empty;
      }
      iVar1 = snprintf(local_430 + local_438,0x3ff - local_438,":\"%s:%s\":\n",pcVar3,pcVar4);
    }
    local_438 = local_438 + (long)iVar1;
  }
  QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,local_430);
  if (&(local_478.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_478.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_478.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_478.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_478.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_458.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_458.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_458.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00120b0f:
  __stack_chk_fail();
}

Assistant:

void QPlainTestLogger::printBenchmarkResultsHeader(const QBenchmarkResult &result)
{
    FixedBufString<1022> buf;
    buf.appendf("%s: %s::%s", QTest::benchmarkResult2String(),
                QTestResult::currentTestObjectName(), result.context.slotName.toLatin1().data());

    QByteArray tag = QTestResult::currentDataTag();
    QByteArray gtag = QTestResult::currentGlobalDataTag();

    if (!gtag.isEmpty() && !tag.isEmpty())
        buf.appendf(":\"%s:%s\":\n", gtag.constData(), tag.constData());
    else if (!gtag.isEmpty())
        buf.appendf(":\"%s\":\n", gtag.constData());
    else if (!tag.isEmpty())
        buf.appendf(":\"%s\":\n", tag.constData());
    else
        buf.append(":\n");
    outputMessage(buf);
}